

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O2

bool __thiscall duckdb::HugeintTryCastInteger<long,true>(duckdb *this,hugeint_t input,long *result)

{
  if (input.lower == 0xffffffffffffffff) {
    if (-1 < (long)this) {
      return false;
    }
  }
  else if ((input.lower != 0) || ((long)this < 0)) {
    return false;
  }
  *(duckdb **)input.upper = this;
  return true;
}

Assistant:

bool HugeintTryCastInteger(hugeint_t input, DST &result) {
	switch (input.upper) {
	case 0:
		// positive number: check if the positive number is in range
		if (input.lower <= uint64_t(NumericLimits<DST>::Maximum())) {
			result = DST(input.lower);
			return true;
		}
		break;
	case -1:
		if (!SIGNED) {
			return false;
		}
		// negative number: check if the negative number is in range
		if (input.lower >= NumericLimits<uint64_t>::Maximum() - uint64_t(NumericLimits<DST>::Maximum())) {
			result = -DST(NumericLimits<uint64_t>::Maximum() - input.lower) - 1;
			return true;
		}
		break;
	default:
		break;
	}
	return false;
}